

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solve3right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *y2,SVectorBase<double> *b,SSVectorBase<double> *rhs,
          SSVectorBase<double> *rhs2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  SSVectorBase<double> *rhs_00;
  element_type *this_00;
  double *rhs_01;
  int *idx;
  double *vec;
  double *pdVar4;
  SSVectorBase<double> *this_01;
  SSVectorBase<double> *in_RSI;
  double *in_RDI;
  SSVectorBase<double> *in_R9;
  double *pdVar5;
  SSVectorBase<double> *in_stack_00000008;
  double epsilon;
  int *ridx2;
  int rsize2;
  int *ridx;
  int rsize;
  int *sidx;
  int f;
  int n;
  int m;
  CLUFactor<double> *in_stack_fffffffffffffe18;
  int n_00;
  SSVectorBase<double> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe54;
  double in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  int rn;
  int *in_stack_fffffffffffffee0;
  double *forest;
  double *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SSVectorBase<double> *this_02;
  int *ridx2_00;
  int rn2;
  double *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  (**(code **)(*(long *)in_RDI[0x71] + 0x18))();
  this_02 = (SSVectorBase<double> *)(in_RDI + 0x4f);
  piVar3 = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe20);
  SSVectorBase<double>::setSize
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  SSVectorBase<double>::forceSetup(this_02);
  SSVectorBase<double>::size((SSVectorBase<double> *)0x251316);
  SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe20);
  iVar1 = SSVectorBase<double>::size((SSVectorBase<double> *)0x25133f);
  rhs_00 = (SSVectorBase<double> *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe20);
  ridx2_00 = (int *)&stack0xffffffffffffff50;
  CLUFactor<double>::tolerances(in_stack_fffffffffffffe18);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x251389);
  pdVar5 = (double *)Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2513a9);
  forest = pdVar5;
  SSVectorBase<double>::clear(in_stack_fffffffffffffe20);
  rn2 = (int)pdVar5;
  VectorBase<double>::clear
            ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  VectorBase<double>::clear
            ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  *(undefined1 *)(in_RDI + 0x59) = 1;
  SSVectorBase<double>::operator=
            (in_stack_fffffffffffffe20,(SVectorBase<double> *)in_stack_fffffffffffffe18);
  if (*(int *)(in_RDI + 0x16) == 0) {
    iVar2 = SSVectorBase<double>::size((SSVectorBase<double> *)0x25142e);
    rn = (int)((ulong)(in_RDI + 2) >> 0x20);
    pdVar5 = forest;
    rhs_01 = SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    idx = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe20);
    vec = SSVectorBase<double>::get_ptr((SSVectorBase<double> *)0x25149b);
    pdVar4 = VectorBase<double>::get_ptr((VectorBase<double> *)0x2514ce);
    n_00 = (int)((ulong)pdVar4 >> 0x20);
    this_01 = (SSVectorBase<double> *)SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    VectorBase<double>::get_ptr((VectorBase<double> *)0x25150f);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    CLUFactor<double>::vSolveRight4update3
              ((CLUFactor<double> *)CONCAT44(iVar2,in_stack_ffffffffffffff08),(double)piVar3,vec,idx
               ,rhs_01,(int *)forest,rn,(double *)this_02,in_stack_fffffffffffffed0,in_RDI,ridx2_00,
               rn2,in_stack_ffffffffffffff40,in_stack_fffffffffffffec8,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,pdVar5,(int *)rhs_00,
               (int *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
    SSVectorBase<double>::setSize(this_01,n_00);
    SSVectorBase<double>::unSetup(in_RSI);
    SSVectorBase<double>::setup_and_assign<double>
              ((SSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe54,iVar1),rhs_00);
  }
  else {
    SSVectorBase<double>::clear(in_stack_fffffffffffffe20);
    SSVectorBase<double>::size((SSVectorBase<double> *)0x25166d);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe20);
    SSVectorBase<double>::get_ptr((SSVectorBase<double> *)0x2516ce);
    pdVar5 = VectorBase<double>::get_ptr((VectorBase<double> *)0x2516fe);
    n_00 = (int)((ulong)pdVar5 >> 0x20);
    this_01 = (SSVectorBase<double> *)SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    VectorBase<double>::get_ptr((VectorBase<double> *)0x251749);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffe20);
    piVar3 = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe20);
    CLUFactor<double>::vSolveRight4update3
              ((CLUFactor<double> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,iVar2,(double *)this_02,
               (double)piVar3,in_RDI,ridx2_00,rn2,in_stack_ffffffffffffff40,(double)this_01,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,forest,
               (int *)rhs_00,(int *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
    SSVectorBase<double>::setSize(this_01,n_00);
    SSVectorBase<double>::forceSetup(in_RSI);
    SSVectorBase<double>::setSize(this_01,n_00);
    SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 100));
  }
  SSVectorBase<double>::forceSetup(in_R9);
  SSVectorBase<double>::forceSetup(in_stack_00000008);
  SSVectorBase<double>::setSize(this_01,n_00);
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 0x4f));
  *(int *)((long)in_RDI + 0x394) = *(int *)((long)in_RDI + 0x394) + 3;
  (**(code **)(*(long *)in_RDI[0x71] + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}